

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O0

void accepted(accept_stat acpt_stat,rpc_err *error)

{
  rpc_err *error_local;
  accept_stat acpt_stat_local;
  
  if (error == (rpc_err *)0x0) {
    __assert_fail("error != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xb8,"void accepted(enum accept_stat, struct rpc_err *)");
  }
  switch(acpt_stat) {
  case SUCCESS:
    error->re_status = RPC_SUCCESS;
    break;
  case PROG_UNAVAIL:
    error->re_status = RPC_PROGUNAVAIL;
    break;
  case PROG_MISMATCH:
    error->re_status = RPC_PROGVERSMISMATCH;
    break;
  case PROC_UNAVAIL:
    error->re_status = RPC_PROCUNAVAIL;
    break;
  case GARBAGE_ARGS:
    error->re_status = RPC_CANTDECODEARGS;
    break;
  case SYSTEM_ERR:
    error->re_status = RPC_SYSTEMERROR;
    break;
  default:
    error->re_status = RPC_FAILED;
    (error->ru).RE_errno = 0;
    (error->ru).RE_vers.high = acpt_stat;
  }
  return;
}

Assistant:

static void
accepted(enum accept_stat acpt_stat, struct rpc_err *error)
{
	assert(error != NULL);

	switch (acpt_stat) {

	case PROG_UNAVAIL:
		error->re_status = RPC_PROGUNAVAIL;
		return;

	case PROG_MISMATCH:
		error->re_status = RPC_PROGVERSMISMATCH;
		return;

	case PROC_UNAVAIL:
		error->re_status = RPC_PROCUNAVAIL;
		return;

	case GARBAGE_ARGS:
		error->re_status = RPC_CANTDECODEARGS;
		return;

	case SYSTEM_ERR:
		error->re_status = RPC_SYSTEMERROR;
		return;

	case SUCCESS:
		error->re_status = RPC_SUCCESS;
		return;
	}
	/* NOTREACHED */
	/* something's wrong, but we don't know what ... */
	error->re_status = RPC_FAILED;
	error->re_lb.s1 = (int32_t) MSG_ACCEPTED;
	error->re_lb.s2 = (int32_t) acpt_stat;
}